

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O1

void __thiscall w3Interp::BlockEnd(w3Interp *this)

{
  long lVar1;
  undefined8 *extraout_RAX;
  undefined8 *puVar2;
  undefined8 extraout_RAX_00;
  ulong uVar3;
  char extraout_DL;
  char cVar4;
  ulong uVar5;
  w3Stack *this_00;
  string local_28;
  
  lVar1 = (long)(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar1 != 0) {
    this_00 = &this->super_w3Stack;
    lVar1 = lVar1 >> 4;
    uVar5 = lVar1 * -0x5555555555555555;
    puVar2 = (undefined8 *)
             ((long)&((this_00->super_w3StackBase).super_w3StackBaseBase.
                      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                      super__Vector_impl_data._M_start)->tag + lVar1 * 0x10);
    uVar3 = 0;
    do {
      cVar4 = *(char *)(puVar2 + -6);
      if (cVar4 != -0x80) goto LAB_00119c72;
      puVar2 = puVar2 + -6;
      uVar3 = uVar3 + 1;
    } while (uVar5 - uVar3 != 0);
    do {
      BlockEnd();
      puVar2 = extraout_RAX;
      cVar4 = extraout_DL;
LAB_00119c72:
    } while (1 < (byte)(cVar4 + 0x7fU));
    if (~uVar3 + uVar5 < uVar5) {
      lVar1 = uVar3 + 1;
      do {
        puVar2[-2] = puVar2[4];
        puVar2[-1] = puVar2[5];
        puVar2[-4] = puVar2[2];
        puVar2[-3] = puVar2[3];
        puVar2[-6] = *puVar2;
        puVar2[-5] = puVar2[1];
        puVar2 = puVar2 + 6;
        lVar1 = lVar1 + -1;
      } while (lVar1 != 0);
    }
    std::vector<w3StackValue,_std::allocator<w3StackValue>_>::resize
              ((vector<w3StackValue,_std::allocator<w3StackValue>_> *)this_00,uVar5 - 1);
    return;
  }
  StringFormat_abi_cxx11_(&local_28,"%lX",0);
  AssertFailedFormat("s > 0",&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

INTERP (Rem_s_i64)
{
    const int64_t a = pop_i64 ();
    i64 () %= a;
}